

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

vector<CNetAddr,_std::allocator<CNetAddr>_> * WrappedGetAddrInfo(string *name,bool allow_lookup)

{
  int iVar1;
  char *pcVar2;
  byte in_DL;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *in_RDI;
  long in_FS_OFFSET;
  sockaddr_in6 *s6;
  addrinfo *ai_trav;
  int n_err_retry;
  int n_err;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *resolved_addresses;
  addrinfo *ai_res;
  addrinfo ai_hint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__args;
  sockaddr *in_stack_ffffffffffffff78;
  addrinfo *local_68;
  addrinfo *local_40;
  addrinfo local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __args = in_RDI;
  memset(&local_38,0,0x30);
  local_38.ai_socktype = 1;
  local_38.ai_protocol = 6;
  local_38.ai_family = 0;
  local_38.ai_flags = 4;
  if ((in_DL & 1) != 0) {
    local_38.ai_flags = 0x20;
  }
  local_40 = (addrinfo *)0x0;
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff58);
  iVar1 = getaddrinfo(pcVar2,(char *)0x0,&local_38,&local_40);
  if (iVar1 != 0) {
    if ((local_38.ai_flags & 0x20U) != 0x20) {
      memset(in_RDI,0,0x18);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff58);
      goto LAB_00e07700;
    }
    local_38.ai_flags = local_38.ai_flags & 0xffffffdf;
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_ffffffffffffff58);
    iVar1 = getaddrinfo(pcVar2,(char *)0x0,&local_38,&local_40);
    if (iVar1 != 0) {
      memset(in_RDI,0,0x18);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff58);
      goto LAB_00e07700;
    }
  }
  local_68 = local_40;
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff58);
  for (; local_68 != (addrinfo *)0x0; local_68 = local_68->ai_next) {
    if (local_68->ai_family == 2) {
      if (local_68->ai_addrlen < 0x10) {
        __assert_fail("ai_trav->ai_addrlen >= sizeof(sockaddr_in)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                      ,0x53,"std::vector<CNetAddr> WrappedGetAddrInfo(const std::string &, bool)");
      }
      std::vector<CNetAddr,std::allocator<CNetAddr>>::emplace_back<in_addr&>
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff78,
                 (in_addr *)__args);
    }
    if (local_68->ai_family == 10) {
      if (local_68->ai_addrlen < 0x1c) {
        __assert_fail("ai_trav->ai_addrlen >= sizeof(sockaddr_in6)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                      ,0x57,"std::vector<CNetAddr> WrappedGetAddrInfo(const std::string &, bool)");
      }
      in_stack_ffffffffffffff78 = local_68->ai_addr;
      std::vector<CNetAddr,std::allocator<CNetAddr>>::
      emplace_back<in6_addr_const&,unsigned_int_const&>
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff78,
                 (in6_addr *)__args,(uint *)in_RDI);
    }
  }
  freeaddrinfo(local_40);
LAB_00e07700:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return __args;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CNetAddr> WrappedGetAddrInfo(const std::string& name, bool allow_lookup)
{
    addrinfo ai_hint{};
    // We want a TCP port, which is a streaming socket type
    ai_hint.ai_socktype = SOCK_STREAM;
    ai_hint.ai_protocol = IPPROTO_TCP;
    // We don't care which address family (IPv4 or IPv6) is returned
    ai_hint.ai_family = AF_UNSPEC;

    // If we allow lookups of hostnames, use the AI_ADDRCONFIG flag to only
    // return addresses whose family we have an address configured for.
    //
    // If we don't allow lookups, then use the AI_NUMERICHOST flag for
    // getaddrinfo to only decode numerical network addresses and suppress
    // hostname lookups.
    ai_hint.ai_flags = allow_lookup ? AI_ADDRCONFIG : AI_NUMERICHOST;

    addrinfo* ai_res{nullptr};
    const int n_err{getaddrinfo(name.c_str(), nullptr, &ai_hint, &ai_res)};
    if (n_err != 0) {
        if ((ai_hint.ai_flags & AI_ADDRCONFIG) == AI_ADDRCONFIG) {
            // AI_ADDRCONFIG on some systems may exclude loopback-only addresses
            // If first lookup failed we perform a second lookup without AI_ADDRCONFIG
            ai_hint.ai_flags = (ai_hint.ai_flags & ~AI_ADDRCONFIG);
            const int n_err_retry{getaddrinfo(name.c_str(), nullptr, &ai_hint, &ai_res)};
            if (n_err_retry != 0) {
                return {};
            }
        } else {
            return {};
        }
    }

    // Traverse the linked list starting with ai_trav.
    addrinfo* ai_trav{ai_res};
    std::vector<CNetAddr> resolved_addresses;
    while (ai_trav != nullptr) {
        if (ai_trav->ai_family == AF_INET) {
            assert(ai_trav->ai_addrlen >= sizeof(sockaddr_in));
            resolved_addresses.emplace_back(reinterpret_cast<sockaddr_in*>(ai_trav->ai_addr)->sin_addr);
        }
        if (ai_trav->ai_family == AF_INET6) {
            assert(ai_trav->ai_addrlen >= sizeof(sockaddr_in6));
            const sockaddr_in6* s6{reinterpret_cast<sockaddr_in6*>(ai_trav->ai_addr)};
            resolved_addresses.emplace_back(s6->sin6_addr, s6->sin6_scope_id);
        }
        ai_trav = ai_trav->ai_next;
    }
    freeaddrinfo(ai_res);

    return resolved_addresses;
}